

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O0

void __thiscall NaCustomFunc::PrintLog(NaCustomFunc *this,char *szIndent)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_RSI;
  long *in_RDI;
  uint i;
  char *indent;
  uint i_00;
  char *local_40;
  char *local_30;
  uint local_1c;
  
  uVar2 = (**(code **)(*in_RDI + 0x68))();
  if ((uVar2 & 1) == 0) {
    local_30 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_30 = "";
    }
    pcVar3 = NaConfigPart::GetInstance((NaConfigPart *)(in_RDI + 4));
    if (pcVar3 == (char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = NaConfigPart::GetInstance((NaConfigPart *)(in_RDI + 4));
    }
    NaPrintLog("%sCustom function %s:\n",local_30,local_40);
    NaPrintLog("%s  file    %s\n",local_30,in_RDI[8]);
    if (in_RDI[9] == 0) {
      pcVar3 = "(nil)";
    }
    else {
      pcVar3 = (char *)in_RDI[9];
    }
    NaPrintLog("%s  options %s\n",local_30,pcVar3);
    NaPrintLog("%s  initial");
    local_1c = 0;
    while (i_00 = local_1c, uVar1 = NaVector::dim((NaVector *)(in_RDI + 10)), i_00 < uVar1) {
      NaVector::operator()((NaVector *)pcVar3,i_00);
      NaPrintLog(" %g");
      local_1c = local_1c + 1;
    }
    NaPrintLog("\n");
    NaPrintLog("%s  shared object     %p\n",in_RDI[0xd]);
    NaPrintLog("%s  external function %p\n",in_RDI[0xe]);
  }
  return;
}

Assistant:

void
NaCustomFunc::PrintLog (const char* szIndent) const
{
  if(Empty())
    return;

  const char	*indent = (NULL == szIndent)? "": szIndent;
  NaPrintLog("%sCustom function %s:\n", indent,
	     (NULL == GetInstance())? "": GetInstance());
  NaPrintLog("%s  file    %s\n", indent, szFile);
  NaPrintLog("%s  options %s\n", indent, NULL==szOptions?"(nil)":szOptions);
  NaPrintLog("%s  initial");

  unsigned	i;
  for(i = 0; i < vInitial.dim(); ++i){
    NaPrintLog(" %g", vInitial(i));
  }
  NaPrintLog("\n");

  NaPrintLog("%s  shared object     %p\n", so);
  NaPrintLog("%s  external function %p\n", exfunc);
}